

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRightCircularCone::IfcRightCircularCone(IfcRightCircularCone *this)

{
  IfcRightCircularCone *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x58,"IfcRightCircularCone");
  IfcCsgPrimitive3D::IfcCsgPrimitive3D
            (&this->super_IfcCsgPrimitive3D,&PTR_construction_vtable_24__00fdec88);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRightCircularCone,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcRightCircularCone,_2UL> *)
             &(this->super_IfcCsgPrimitive3D).field_0x38,&PTR_construction_vtable_24__00fded00);
  (this->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xfdebd0;
  *(undefined8 *)&this->field_0x58 = 0xfdec70;
  *(undefined8 *)
   &(this->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xfdebf8;
  *(undefined8 *)
   &(this->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xfdec20;
  *(undefined8 *)&(this->super_IfcCsgPrimitive3D).field_0x38 = 0xfdec48;
  return;
}

Assistant:

IfcRightCircularCone() : Object("IfcRightCircularCone") {}